

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddKeyOriginWithDB
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CPubKey *pubkey,KeyOriginInfo *info)

{
  byte bVar1;
  mapped_type *__str;
  mapped_type *pmVar2;
  CKeyMetadata *meta;
  long in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  CPubKey *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  uchar *in_stack_fffffffffffffeb0;
  key_type *in_stack_fffffffffffffeb8;
  key_type *__k;
  CPubKey *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  undefined1 apostrophe;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffed0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffed8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff38;
  key_type local_68 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe98);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (char *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x18,0));
  apostrophe = (undefined1)((ulong)in_stack_fffffffffffffec8 >> 0x38);
  CPubKey::GetID(in_stack_fffffffffffffec0);
  std::
  map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
  ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::copy<unsigned_char_const*,unsigned_char*>
            ((uchar *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             (uchar *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RCX + 8);
  CPubKey::GetID(in_stack_fffffffffffffec0);
  __str = std::
          map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
          ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                        *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  CPubKey::GetID(in_stack_fffffffffffffec0);
  pmVar2 = std::
           map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
           ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                         *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  pmVar2->has_key_origin = true;
  WriteHDKeypath_abi_cxx11_
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffed0,
             (bool)apostrophe);
  CPubKey::GetID(in_stack_fffffffffffffec0);
  pmVar2 = std::
           map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
           ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                         *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  __k = local_68;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
  std::__cxx11::string::~string(in_stack_fffffffffffffe98);
  meta = (CKeyMetadata *)(in_RDI + 0x200);
  CPubKey::GetID(in_RSI);
  std::
  map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
  ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                *)in_RSI,__k);
  bVar1 = WalletBatch::WriteKeyMetadata
                    ((WalletBatch *)pmVar2,meta,in_RSI,SUB81((ulong)__k >> 0x38,0));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::AddKeyOriginWithDB(WalletBatch& batch, const CPubKey& pubkey, const KeyOriginInfo& info)
{
    LOCK(cs_KeyStore);
    std::copy(info.fingerprint, info.fingerprint + 4, mapKeyMetadata[pubkey.GetID()].key_origin.fingerprint);
    mapKeyMetadata[pubkey.GetID()].key_origin.path = info.path;
    mapKeyMetadata[pubkey.GetID()].has_key_origin = true;
    mapKeyMetadata[pubkey.GetID()].hdKeypath = WriteHDKeypath(info.path, /*apostrophe=*/true);
    return batch.WriteKeyMetadata(mapKeyMetadata[pubkey.GetID()], pubkey, true);
}